

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMatrix(AsciiParser *this,matrix2d *result)

{
  bool bVar1;
  long lVar2;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> content;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = Expect(this,'(');
  if (!bVar1) {
    return false;
  }
  content.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  content.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  content.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = SepBy1TupleType<double,2ul>(this,',',&content);
  if (bVar1) {
    if ((long)content.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)content.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      bVar1 = Expect(this,')');
      if (bVar1) {
        for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 0x10) {
          *(undefined8 *)((long)result->m[0] + lVar2) =
               *(undefined8 *)
                ((long)(content.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2);
          *(undefined8 *)((long)result->m[0] + lVar2 + 8) =
               *(undefined8 *)
                ((long)(content.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2 + 8);
        }
        bVar1 = true;
        goto LAB_002b8e7e;
      }
    }
    else {
      std::__cxx11::to_string
                (&local_80,
                 (long)content.
                       super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)content.
                       super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      ::std::operator+(&local_60,"# of rows in matrix2d must be 2, but got ",&local_80);
      ::std::operator+(&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60,"\n");
      PushError(this,&local_40);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  bVar1 = false;
LAB_002b8e7e:
  ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
  ~_Vector_base(&content.
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               );
  return bVar1;
}

Assistant:

bool AsciiParser::ParseMatrix(value::matrix2d *result) {

  if (!Expect('(')) {
    return false;
  }

  std::vector<std::array<double, 2>> content;
  if (!SepBy1TupleType<double, 2>(',', &content)) {
    return false;
  }

  if (content.size() != 2) {
    PushError("# of rows in matrix2d must be 2, but got " +
              std::to_string(content.size()) + "\n");
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  for (size_t i = 0; i < 2; i++) {
    result->m[i][0] = content[i][0];
    result->m[i][1] = content[i][1];
  }

  return true;
}